

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O2

int p2sc_spawn(char *cmd,char **sout,char **serr)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int stat;
  GError *err;
  
  iVar2 = g_spawn_command_line_sync();
  if (iVar2 == 0) {
    _p2sc_msg("p2sc_spawn",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
              ,0xa7,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",4000,
              "spawn(%s): unknown failure",cmd);
    exit(1);
  }
  if (stat == 0) {
    stat = 0;
  }
  else {
    pcVar1 = *sout;
    pcVar3 = "(null)";
    if ((pcVar1 != (char *)0x0) && (pcVar3 = "(null)", *pcVar1 != '\0')) {
      pcVar3 = pcVar1;
    }
    pcVar1 = *serr;
    pcVar4 = "(null)";
    if ((pcVar1 != (char *)0x0) && (pcVar4 = "(null)", *pcVar1 != '\0')) {
      pcVar4 = pcVar1;
    }
    _p2sc_msg("p2sc_spawn",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
              ,0xae,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",3000,
              "%s failed with exit status:%d\nstdout: %s\nstderr: %s",cmd,(ulong)(uint)stat,pcVar3,
              pcVar4);
  }
  return stat;
}

Assistant:

int p2sc_spawn(const char *cmd, char **sout, char **serr) {
    int stat;
    GError *err = NULL;

    if (!g_spawn_command_line_sync(cmd, sout, serr, &stat, &err)) {
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL, "spawn(%s): %s", cmd, err->message);
            g_error_free(err);
        } else
            P2SC_Msg(LVL_FATAL, "spawn(%s): unknown failure", cmd);
    }

    if (stat)
        P2SC_Msg(LVL_WARNING,
                 "%s failed with exit status:%d\nstdout: %s\nstderr: %s",
                 cmd, stat, (*sout && **sout) ? *sout : "(null)",
                 (*serr && **serr) ? *serr : "(null)");

    return stat;
}